

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FFontChar1::MakeTexture(FFontChar1 *this)

{
  int iVar1;
  BYTE *pBVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  pBVar2 = (BYTE *)operator_new__((ulong)(this->super_FTexture).Height *
                                  (ulong)(this->super_FTexture).Width);
  this->Pixels = pBVar2;
  iVar1 = (*this->BaseTexture->_vptr_FTexture[3])();
  if (this->SourceRemap != (BYTE *)0x0) {
    if ((this->super_FTexture).Height != 0 && (this->super_FTexture).Width != 0) {
      uVar3 = 0;
      do {
        this->Pixels[uVar3] =
             this->SourceRemap[*(byte *)((long)CONCAT44(extraout_var,iVar1) + uVar3)];
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(this->super_FTexture).Height * (ulong)(this->super_FTexture).Width);
    }
    return;
  }
  memcpy(this->Pixels,(void *)CONCAT44(extraout_var,iVar1),
         (ulong)(this->super_FTexture).Height * (ulong)(this->super_FTexture).Width);
  return;
}

Assistant:

void FFontChar1::MakeTexture ()
{
	// Make the texture as normal, then remap it so that all the colors
	// are at the low end of the palette
	Pixels = new BYTE[Width*Height];
	const BYTE *pix = BaseTexture->GetPixels();

	if (!SourceRemap)
	{
		memcpy(Pixels, pix, Width*Height);
	}
	else
	{
		for (int x = 0; x < Width*Height; ++x)
		{
			Pixels[x] = SourceRemap[pix[x]];
		}
	}
}